

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
MultiBodyInplaceSolverIslandCallback::processIsland
          (MultiBodyInplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  long *plVar1;
  btMultiBodyConstraint *pbVar2;
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  btMultiBodyConstraint **ptr_02;
  int iVar3;
  int iVar4;
  uint uVar5;
  btCollisionObject **ppbVar6;
  btPersistentManifold **ppbVar7;
  btTypedConstraint **ppbVar8;
  btMultiBodyConstraint **ppbVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  btTypedConstraint **ppbVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar17;
  long local_68;
  
  if (islandId < 0) {
    (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
      _vptr_btConstraintSolver[0xd])();
  }
  else {
    iVar4 = this->m_numConstraints;
    uVar15 = 0;
    if ((long)iVar4 < 1) {
      uVar13 = 0;
      ppbVar14 = (btTypedConstraint **)0x0;
LAB_001c6dc2:
      if ((int)uVar13 < iVar4) {
        uVar13 = uVar13 & 0xffffffff;
        uVar15 = 0;
        do {
          iVar3 = (this->m_sortedConstraints[uVar13]->m_rbA->super_btCollisionObject).m_islandTag1;
          if (iVar3 < 0) {
            iVar3 = (this->m_sortedConstraints[uVar13]->m_rbB->super_btCollisionObject).m_islandTag1
            ;
          }
          uVar15 = (ulong)((int)uVar15 + (uint)(iVar3 == islandId));
          uVar13 = uVar13 + 1;
        } while ((int)uVar13 < iVar4);
      }
    }
    else {
      ppbVar14 = this->m_sortedConstraints;
      uVar13 = 0;
      do {
        iVar3 = ((*ppbVar14)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar3 < 0) {
          iVar3 = ((*ppbVar14)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        if (iVar3 == islandId) goto LAB_001c6dc2;
        uVar13 = uVar13 + 1;
        ppbVar14 = ppbVar14 + 1;
      } while ((long)iVar4 != uVar13);
      ppbVar14 = (btTypedConstraint **)0x0;
      uVar15 = 0;
    }
    iVar4 = this->m_numMultiBodyConstraints;
    if (iVar4 < 1) {
      uVar13 = 0;
    }
    else {
      local_68 = 0;
      uVar13 = 0;
      do {
        plVar1 = *(long **)((long)this->m_multiBodySortedConstraints + local_68);
        iVar3 = (**(code **)(*plVar1 + 0x18))(plVar1);
        iVar4 = (**(code **)(*plVar1 + 0x20))(plVar1);
        if (-1 < iVar3) {
          iVar4 = iVar3;
        }
        if (iVar4 == islandId) {
          local_68 = local_68 + (long)this->m_multiBodySortedConstraints;
          iVar4 = this->m_numMultiBodyConstraints;
          goto LAB_001c6e7d;
        }
        uVar13 = uVar13 + 1;
        iVar4 = this->m_numMultiBodyConstraints;
        local_68 = local_68 + 8;
      } while ((long)uVar13 < (long)iVar4);
    }
    local_68 = 0;
LAB_001c6e7d:
    uVar17 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    uVar16 = 0;
    if ((int)uVar13 < iVar4) {
      uVar13 = uVar13 & 0xffffffff;
      uVar16 = 0;
      do {
        pbVar2 = this->m_multiBodySortedConstraints[uVar13];
        iVar3 = (*pbVar2->_vptr_btMultiBodyConstraint[3])(pbVar2);
        iVar4 = (*pbVar2->_vptr_btMultiBodyConstraint[4])(pbVar2);
        uVar17 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (-1 < iVar3) {
          iVar4 = iVar3;
        }
        uVar16 = (ulong)((int)uVar16 + (uint)(iVar4 == islandId));
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < this->m_numMultiBodyConstraints);
    }
    if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize < 2) {
      (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
        _vptr_btConstraintSolver[3])
                (this->m_solver,bodies,(ulong)(uint)numBodies,manifolds,(ulong)(uint)numManifolds,
                 ppbVar14,CONCAT44(uVar17,(int)uVar15),this->m_solverInfo,this->m_debugDrawer,
                 this->m_dispatcher);
    }
    else {
      if (0 < numBodies) {
        uVar10 = (this->m_bodies).m_size;
        uVar5 = (this->m_bodies).m_capacity;
        uVar13 = 0;
        do {
          if (uVar10 == uVar5) {
            uVar12 = uVar5 * 2;
            if (uVar5 == 0) {
              uVar12 = 1;
            }
            uVar10 = uVar5;
            if ((int)uVar5 < (int)uVar12) {
              if (uVar12 == 0) {
                ppbVar6 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar6 = (btCollisionObject **)btAlignedAllocInternal((long)(int)uVar12 << 3,0x10);
                uVar5 = (this->m_bodies).m_size;
              }
              if (0 < (int)uVar5) {
                uVar11 = 0;
                do {
                  ppbVar6[uVar11] = (this->m_bodies).m_data[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar5 != uVar11);
              }
              ptr = (this->m_bodies).m_data;
              if ((ptr != (btCollisionObject **)0x0) && ((this->m_bodies).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr);
                uVar5 = (this->m_bodies).m_size;
              }
              (this->m_bodies).m_ownsMemory = true;
              (this->m_bodies).m_data = ppbVar6;
              (this->m_bodies).m_capacity = uVar12;
              uVar10 = uVar5;
              uVar5 = uVar12;
            }
          }
          (this->m_bodies).m_data[(int)uVar10] = bodies[uVar13];
          uVar10 = uVar10 + 1;
          (this->m_bodies).m_size = uVar10;
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)numBodies);
      }
      if (0 < numManifolds) {
        uVar10 = (this->m_manifolds).m_size;
        uVar5 = (this->m_manifolds).m_capacity;
        uVar13 = 0;
        do {
          if (uVar10 == uVar5) {
            uVar12 = uVar5 * 2;
            if (uVar5 == 0) {
              uVar12 = 1;
            }
            uVar10 = uVar5;
            if ((int)uVar5 < (int)uVar12) {
              if (uVar12 == 0) {
                ppbVar7 = (btPersistentManifold **)0x0;
              }
              else {
                ppbVar7 = (btPersistentManifold **)
                          btAlignedAllocInternal((long)(int)uVar12 << 3,0x10);
                uVar5 = (this->m_manifolds).m_size;
              }
              if (0 < (int)uVar5) {
                uVar11 = 0;
                do {
                  ppbVar7[uVar11] = (this->m_manifolds).m_data[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar5 != uVar11);
              }
              ptr_00 = (this->m_manifolds).m_data;
              if ((ptr_00 != (btPersistentManifold **)0x0) &&
                 ((this->m_manifolds).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr_00);
                uVar5 = (this->m_manifolds).m_size;
              }
              (this->m_manifolds).m_ownsMemory = true;
              (this->m_manifolds).m_data = ppbVar7;
              (this->m_manifolds).m_capacity = uVar12;
              uVar10 = uVar5;
              uVar5 = uVar12;
            }
          }
          (this->m_manifolds).m_data[(int)uVar10] = manifolds[uVar13];
          uVar10 = uVar10 + 1;
          (this->m_manifolds).m_size = uVar10;
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)numManifolds);
      }
      if (0 < (int)uVar15) {
        uVar10 = (this->m_constraints).m_size;
        uVar5 = (this->m_constraints).m_capacity;
        uVar13 = 0;
        do {
          if (uVar10 == uVar5) {
            uVar12 = uVar5 * 2;
            if (uVar5 == 0) {
              uVar12 = 1;
            }
            uVar10 = uVar5;
            if ((int)uVar5 < (int)uVar12) {
              if (uVar12 == 0) {
                ppbVar8 = (btTypedConstraint **)0x0;
              }
              else {
                ppbVar8 = (btTypedConstraint **)btAlignedAllocInternal((long)(int)uVar12 << 3,0x10);
                uVar5 = (this->m_constraints).m_size;
              }
              if (0 < (int)uVar5) {
                uVar11 = 0;
                do {
                  ppbVar8[uVar11] = (this->m_constraints).m_data[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar5 != uVar11);
              }
              ptr_01 = (this->m_constraints).m_data;
              if ((ptr_01 != (btTypedConstraint **)0x0) &&
                 ((this->m_constraints).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr_01);
                uVar5 = (this->m_constraints).m_size;
              }
              (this->m_constraints).m_ownsMemory = true;
              (this->m_constraints).m_data = ppbVar8;
              (this->m_constraints).m_capacity = uVar12;
              uVar10 = uVar5;
              uVar5 = uVar12;
            }
          }
          (this->m_constraints).m_data[(int)uVar10] = ppbVar14[uVar13];
          uVar10 = uVar10 + 1;
          (this->m_constraints).m_size = uVar10;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar15);
      }
      if (0 < (int)uVar16) {
        uVar10 = (this->m_multiBodyConstraints).m_size;
        uVar5 = (this->m_multiBodyConstraints).m_capacity;
        uVar15 = 0;
        do {
          if (uVar10 == uVar5) {
            uVar12 = uVar5 * 2;
            if (uVar5 == 0) {
              uVar12 = 1;
            }
            uVar10 = uVar5;
            if ((int)uVar5 < (int)uVar12) {
              if (uVar12 == 0) {
                ppbVar9 = (btMultiBodyConstraint **)0x0;
              }
              else {
                ppbVar9 = (btMultiBodyConstraint **)
                          btAlignedAllocInternal((long)(int)uVar12 << 3,0x10);
                uVar5 = (this->m_multiBodyConstraints).m_size;
              }
              if (0 < (int)uVar5) {
                uVar13 = 0;
                do {
                  ppbVar9[uVar13] = (this->m_multiBodyConstraints).m_data[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar5 != uVar13);
              }
              ptr_02 = (this->m_multiBodyConstraints).m_data;
              if ((ptr_02 != (btMultiBodyConstraint **)0x0) &&
                 ((this->m_multiBodyConstraints).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr_02);
                uVar5 = (this->m_multiBodyConstraints).m_size;
              }
              (this->m_multiBodyConstraints).m_ownsMemory = true;
              (this->m_multiBodyConstraints).m_data = ppbVar9;
              (this->m_multiBodyConstraints).m_capacity = uVar12;
              uVar10 = uVar5;
              uVar5 = uVar12;
            }
          }
          (this->m_multiBodyConstraints).m_data[(int)uVar10] =
               *(btMultiBodyConstraint **)(local_68 + uVar15 * 8);
          uVar10 = uVar10 + 1;
          (this->m_multiBodyConstraints).m_size = uVar10;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar16);
      }
      if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize <
          (this->m_manifolds).m_size + (this->m_constraints).m_size) {
        processConstraints(this);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveMultiBodyGroup( bodies,numBodies,manifolds, numManifolds,m_sortedConstraints, m_numConstraints, &m_multiBodySortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			btMultiBodyConstraint** startMultiBodyConstraint = 0;

			int numCurConstraints = 0;
			int numCurMultiBodyConstraints = 0;

			int i;
			
			//find the first constraint for this island

			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			for (i=0;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					
					startMultiBodyConstraint = &m_multiBodySortedConstraints[i];
					break;
				}
			}
			//count the number of multi body constraints in this island
			for (;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					numCurMultiBodyConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{
				
				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				
				for (i=0;i<numCurMultiBodyConstraints;i++)
					m_multiBodyConstraints.push_back(startMultiBodyConstraint[i]);
				
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}